

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O1

bool tchecker::ta::has_guarded_weakly_synchronized_event(system_t *system)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  const_iterator cVar2;
  typed_expression_t *ptVar3;
  bool bVar4;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  rVar5;
  process_events_map_t weakly_sync_map;
  process_events_map_t pStack_48;
  
  tchecker::system::weakly_synchronized_events(&pStack_48,(system_t *)system);
  rVar5 = tchecker::system::edges_t::edges(&(system->super_system_t).super_system_t.super_edges_t);
  for (cVar2._M_current =
            (shared_ptr<tchecker::system::edge_t> *)rVar5._begin.super_const_iterator._M_current;
      bVar4 = (const_iterator)cVar2._M_current !=
              rVar5._end.super_const_iterator._M_current.super_const_iterator, bVar4;
      cVar2._M_current = cVar2._M_current + 1) {
    peVar1 = ((cVar2._M_current)->
             super___shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this = ((cVar2._M_current)->
           super___shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this->_M_use_count = this->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this->_M_use_count = this->_M_use_count + 1;
      }
    }
    bVar4 = tchecker::system::process_events_map_t::contains
                      (&pStack_48,peVar1->_pid,peVar1->_event_id);
    if (bVar4) {
      ptVar3 = system_t::guard(system,peVar1->_id);
      const_evaluate((expression_t *)(&ptVar3->field_0x0 + *(long *)(*(long *)ptVar3 + -0x38)));
    }
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
  }
  std::
  vector<boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>_>_>
  ::~vector(&pStack_48._map);
  return bVar4;
}

Assistant:

bool has_guarded_weakly_synchronized_event(tchecker::ta::system_t const & system)
{
  tchecker::system::process_events_map_t weakly_sync_map =
      tchecker::system::weakly_synchronized_events(system.as_system_system());

  for (tchecker::system::edge_const_shared_ptr_t const & edge : system.edges()) {
    if (weakly_sync_map.contains(edge->pid(), edge->event_id())) {
      try {
        tchecker::const_evaluate(system.guard(edge->id()));
      }
      catch (...) {
        return true;
      }
    }
  }
  return false;
}